

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssertionExpr.cpp
# Opt level: O0

UnaryAssertionOperator slang::ast::getUnaryOp(TokenKind kind)

{
  TokenKind kind_local;
  undefined4 local_4;
  
  if (kind == AlwaysKeyword) {
    local_4 = Always;
  }
  else if (kind == EventuallyKeyword) {
    local_4 = Eventually;
  }
  else if (kind == NextTimeKeyword) {
    local_4 = NextTime;
  }
  else if (kind == NotKeyword) {
    local_4 = Not;
  }
  else if (kind == SAlwaysKeyword) {
    local_4 = SAlways;
  }
  else if (kind == SEventuallyKeyword) {
    local_4 = SEventually;
  }
  else {
    local_4 = SNextTime;
  }
  return local_4;
}

Assistant:

static UnaryAssertionOperator getUnaryOp(TokenKind kind) {
    // clang-format off
    switch (kind) {
        case TokenKind::NotKeyword: return UnaryAssertionOperator::Not;
        case TokenKind::NextTimeKeyword: return UnaryAssertionOperator::NextTime;
        case TokenKind::SNextTimeKeyword: return UnaryAssertionOperator::SNextTime;
        case TokenKind::AlwaysKeyword: return UnaryAssertionOperator::Always;
        case TokenKind::SAlwaysKeyword: return UnaryAssertionOperator::SAlways;
        case TokenKind::EventuallyKeyword: return UnaryAssertionOperator::Eventually;
        case TokenKind::SEventuallyKeyword: return UnaryAssertionOperator::SEventually;
        default: SLANG_UNREACHABLE;
    }
    // clang-format on
}